

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_MakeHttpRequest
              (Upnp_HttpMethod method,char *url_str,void *Handle,UpnpString *headers,
              char *contentType,int contentLength,int timeout)

{
  undefined1 local_130 [8];
  uri_type url;
  http_connection_handle_t *handle;
  membuffer request;
  int ret_code;
  int contentLength_local;
  char *contentType_local;
  UpnpString *headers_local;
  void *Handle_local;
  char *url_str_local;
  Upnp_HttpMethod method_local;
  
  if ((url_str == (char *)0x0) || (Handle == (void *)0x0)) {
    url_str_local._4_4_ = -0x65;
  }
  else {
    *(undefined4 *)((long)Handle + 0x280) = 1;
    *(undefined4 *)((long)Handle + 0x284) = 0;
    url.hostport.IPaddress.__ss_align = (unsigned_long)Handle;
    request.size_inc._4_4_ = contentLength;
    request.size_inc._0_4_ =
         MakeGenericMessage(method,url_str,(membuffer *)&handle,(uri_type *)local_130,contentLength,
                            contentType,headers);
    url_str_local._4_4_ = (int)request.size_inc;
    if ((int)request.size_inc == 0) {
      request.size_inc._0_4_ =
           http_SendMessage((SOCKINFO *)url.hostport.IPaddress.__ss_align,&timeout,"b",handle,
                            request.buf);
      membuffer_destroy((membuffer *)&handle);
      httpmsg_destroy((http_message_t *)(url.hostport.IPaddress.__ss_align + 0x90));
      parser_response_init((http_parser_t *)(url.hostport.IPaddress.__ss_align + 0x90),method);
      url_str_local._4_4_ = (int)request.size_inc;
    }
  }
  return url_str_local._4_4_;
}

Assistant:

int http_MakeHttpRequest(Upnp_HttpMethod method,
	const char *url_str,
	void *Handle,
	UpnpString *headers,
	const char *contentType,
	int contentLength,
	int timeout)
{
	int ret_code;
	membuffer request;
	http_connection_handle_t *handle = Handle;
	uri_type url;
	if (!url_str || !Handle)
		return UPNP_E_INVALID_PARAM;
	if (handle->requestStarted) {
		/* TODO: Log an error that a previous request is already in
		 * progress. */
	}
	handle->requestStarted = 1;
	handle->cancel = 0;
	ret_code = MakeGenericMessage((http_method_t)method,
		url_str,
		&request,
		&url,
		contentLength,
		contentType,
		headers);
	if (ret_code != UPNP_E_SUCCESS)
		return ret_code;
	/* send request */
	ret_code = http_SendMessage(
		&handle->sock_info, &timeout, "b", request.buf, request.length);
	membuffer_destroy(&request);
	httpmsg_destroy(&handle->response.msg);
	parser_response_init(&handle->response, (http_method_t)method);
	return ret_code;
}